

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::Heap::Heap(Heap *this,VirtualMachine *param_1)

{
  VirtualMachine *param_1_local;
  Heap *this_local;
  
  this->_vptr_Heap = (_func_int **)&PTR__Heap_001a3798;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::list(&this->createdStrings);
  std::__cxx11::list<runtime::Function_*,_std::allocator<runtime::Function_*>_>::list
            (&this->createdFunctions);
  std::__cxx11::list<runtime::Object_*,_std::allocator<runtime::Object_*>_>::list
            (&this->createdObjects);
  return;
}

Assistant:

runtime::Heap::Heap(runtime::VirtualMachine* /*vm*/) noexcept {

}